

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall CaPS_SA::Suffix_Array<unsigned_int>::construct(Suffix_Array<unsigned_int> *this)

{
  Suffix_Array<unsigned_int> *this_00;
  ostream *poVar1;
  nanoseconds *in_RDI;
  rep_conflict rVar2;
  idx_t *in_stack_00000008;
  Suffix_Array<unsigned_int> *in_stack_00000010;
  time_point t_end;
  idx_t *P;
  time_point t_start;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffd8;
  
  this_00 = (Suffix_Array<unsigned_int> *)std::chrono::_V2::system_clock::now();
  initialize(this_00);
  permute(this_00);
  sort_subarrays(in_stack_00000010);
  select_pivots(this);
  allocate<unsigned_int>(0);
  locate_pivots(in_stack_00000010,in_stack_00000008);
  partition_sub_subarrays(this,(idx_t *)t_start.__d.__r);
  deallocate<unsigned_int>((uint *)0x10ddd0);
  merge_sub_subarrays(in_stack_00000010);
  compute_partition_boundary_lcp(this_00);
  clean_up(this_00);
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cerr,"Constructed the suffix array. Time taken: ");
  std::chrono::operator-
            (in_stack_ffffffffffffffd8,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)poVar1);
  rVar2 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)poVar1,in_RDI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," seconds.\n");
  return;
}

Assistant:

void Suffix_Array<T_idx_>::construct()
{
    const auto t_start = now();

    initialize();

    permute();

    // merge_sort(SA_w, SA_, n_, LCP_, LCP_w);  // Monolithic construction.

    sort_subarrays();

    select_pivots();

    idx_t* const P = allocate<idx_t>(p_ * (p_ + 1));  // Collection of pivot locations in the subarrays.
    locate_pivots(P);
    partition_sub_subarrays(P);
    deallocate(P);

    merge_sub_subarrays();

    compute_partition_boundary_lcp();

    clean_up();

    const auto t_end = now();
    std::cerr << "Constructed the suffix array. Time taken: " << duration(t_end - t_start) << " seconds.\n";
}